

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_string.c
# Opt level: O1

int lj_cf_string_format(lua_State *L)

{
  double dVar1;
  char cVar2;
  uint uVar3;
  TValue *pTVar4;
  cTValue *pcVar5;
  TValue *pTVar6;
  lua_State *plVar7;
  int iVar8;
  uint uVar9;
  GCstr *pGVar10;
  void *pvVar11;
  size_t sVar12;
  char *pcVar13;
  size_t sVar14;
  char *pcVar15;
  cTValue *pcVar16;
  GCstr *pGVar17;
  ulong uVar18;
  byte *pbVar19;
  int iVar20;
  byte *pbVar21;
  long lVar22;
  byte bVar23;
  cTValue *o;
  byte *__src;
  GCstr *pGVar24;
  bool bVar25;
  char form [18];
  TValue tv;
  char nbuf [32];
  char buff [512];
  luaL_Buffer b;
  undefined8 local_22b0;
  char local_22a8 [32];
  ulong local_2288;
  GCstr *local_2280;
  ulong local_2278;
  cTValue local_2270;
  char local_2268 [32];
  char local_2248 [512];
  luaL_Buffer local_2048;
  
  local_2278 = (long)L->top - (long)L->base;
  iVar20 = 1;
  pGVar10 = lj_lib_checkstr(L,1);
  uVar3 = pGVar10->len;
  local_2048.p = local_2048.buffer;
  local_2048.lvl = 0;
  local_22b0 = L;
  local_2048.L = L;
  if ((ulong)uVar3 != 0) {
    local_2278 = local_2278 >> 3;
    pGVar24 = pGVar10 + 1;
    do {
      if ((byte)(pGVar24->nextgc).gcptr32 != 0x25) {
        if ((&stack0xffffffffffffffd0 <= local_2048.p) &&
           (iVar8 = emptybuffer(&local_2048), iVar8 != 0)) {
          adjuststack(&local_2048);
        }
        bVar23 = (byte)(pGVar24->nextgc).gcptr32;
        pGVar24 = (GCstr *)((long)&(pGVar24->nextgc).gcptr32 + 1);
LAB_00145365:
        *local_2048.p = bVar23;
        local_2048.p = local_2048.p + 1;
        goto LAB_001455b6;
      }
      if (*(byte *)((long)&(pGVar24->nextgc).gcptr32 + 1) == 0x25) {
        if ((&stack0xffffffffffffffd0 <= local_2048.p) &&
           (iVar8 = emptybuffer(&local_2048), iVar8 != 0)) {
          adjuststack(&local_2048);
        }
        bVar23 = *(byte *)((long)&(pGVar24->nextgc).gcptr32 + 1);
        pGVar24 = (GCstr *)((long)&(pGVar24->nextgc).gcptr32 + 2);
        goto LAB_00145365;
      }
      iVar8 = iVar20 + 1;
      if ((int)local_2278 <= iVar20) {
        err_argmsg(local_22b0,iVar8,"no value");
      }
      __src = (byte *)((long)&(pGVar24->nextgc).gcptr32 + 1);
      bVar23 = *__src;
      pbVar21 = __src;
      while ((bVar23 != 0 && (pvVar11 = memchr("-+ #0",(int)(char)bVar23,6), pvVar11 != (void *)0x0)
             )) {
        bVar23 = pbVar21[1];
        pbVar21 = pbVar21 + 1;
      }
      if (5 < (ulong)((long)pbVar21 - (long)__src)) {
        lj_err_caller(local_22b0,LJ_ERR_STRFMTR);
      }
      uVar18 = (ulong)(""[(ulong)bVar23 + 1] >> 3 & 1);
      pbVar21 = pbVar21 + ((""[(ulong)pbVar21[uVar18] + 1] >> 3 & 1) != 0) + uVar18;
      if (*pbVar21 == 0x2e) {
        bVar25 = (""[(ulong)pbVar21[1] + 1] & 8) == 0;
        pbVar19 = pbVar21 + 2;
        if (bVar25) {
          pbVar19 = pbVar21 + 1;
        }
        pbVar21 = pbVar19 + ((""[(ulong)pbVar21[2 - (ulong)bVar25] + 1] >> 3 & 1) != 0);
      }
      if ((""[(ulong)*pbVar21 + 1] & 8) != 0) {
        lj_err_caller(local_22b0,LJ_ERR_STRFMTW);
      }
      local_22a8[0] = '%';
      strncpy(local_22a8 + 1,(char *)__src,(size_t)(pbVar21 + (1 - (long)__src)));
      plVar7 = local_22b0;
      pbVar21[(long)(local_22a8 + (2 - (long)__src))] = 0;
      pGVar24 = (GCstr *)(pbVar21 + 1);
      bVar23 = *pbVar21;
      iVar20 = iVar8;
      if (bVar23 < 0x58) {
        if (((bVar23 != 0x41) && (bVar23 != 0x45)) && (bVar23 != 0x47))
        goto switchD_0014548b_caseD_59;
switchD_0014548b_caseD_61:
        local_2270.n = lj_lib_checknum(local_22b0,iVar8);
        if (0xffdfffff < local_2270.field_2.it * 2) {
          sVar14 = lj_str_bufnum(local_2268,&local_2270);
          if ((char)*pbVar21 < 'a') {
            local_2268[sVar14 - 3] = local_2268[sVar14 - 3] + -0x20;
            local_2268[sVar14 - 2] = local_2268[sVar14 - 2] + -0x20;
            local_2268[sVar14 - 1] = local_2268[sVar14 - 1] + -0x20;
          }
          local_2268[sVar14] = '\0';
          pcVar13 = local_22a8;
          do {
            pcVar15 = pcVar13;
            if ('@' < *pcVar15) break;
            pcVar13 = pcVar15 + 1;
          } while (*pcVar15 != '.');
          pcVar15[0] = 's';
          pcVar15[1] = '\0';
          pcVar13 = local_2268;
          goto LAB_00145594;
        }
        sprintf(local_2248,local_22a8);
        goto LAB_0014559b;
      }
      switch(bVar23) {
      case 0x58:
      case 0x6f:
      case 0x75:
      case 0x78:
        sVar12 = strlen(local_22a8);
        plVar7 = local_22b0;
        cVar2 = local_22a8[sVar12 - 1];
        (local_22a8 + (sVar12 - 1))[0] = 'l';
        (local_22a8 + (sVar12 - 1))[1] = '\0';
        local_22a8[sVar12] = cVar2;
        local_22a8[sVar12 + 1] = '\0';
        lj_lib_checknum(local_22b0,iVar8);
        dVar1 = plVar7->base[(long)iVar8 + -1].n;
        pcVar13 = (char *)((long)(dVar1 - 9.223372036854776e+18) & (long)dVar1 >> 0x3f | (long)dVar1
                          );
        if (*(int *)((long)plVar7->base + (long)iVar8 * 8 + -4) < 0) {
          pcVar13 = (char *)(long)dVar1;
        }
        goto LAB_00145594;
      default:
switchD_0014548b_caseD_59:
        lj_err_callerv(local_22b0,LJ_ERR_STRFMTO,(ulong)(uint)(int)(char)bVar23);
      case 0x61:
      case 0x65:
      case 0x66:
      case 0x67:
        goto switchD_0014548b_caseD_61;
      case 99:
        uVar9 = lj_lib_checkint(local_22b0,iVar8);
        sprintf(local_2248,local_22a8,(ulong)uVar9);
        goto LAB_0014559b;
      case 100:
      case 0x69:
        sVar12 = strlen(local_22a8);
        plVar7 = local_22b0;
        cVar2 = local_22a8[sVar12 - 1];
        (local_22a8 + (sVar12 - 1))[0] = 'l';
        (local_22a8 + (sVar12 - 1))[1] = '\0';
        local_22a8[sVar12] = cVar2;
        local_22a8[sVar12 + 1] = '\0';
        lj_lib_checknum(local_22b0,iVar8);
        pcVar13 = (char *)(long)plVar7->base[(long)iVar8 + -1].n;
LAB_00145594:
        sprintf(local_2248,local_22a8,pcVar13);
LAB_0014559b:
        sVar12 = strlen(local_2248);
        luaL_addlstring(&local_2048,local_2248,sVar12);
        break;
      case 0x70:
        pvVar11 = lua_topointer(local_22b0,iVar8);
        lj_str_pushf(plVar7,"%p",pvVar11);
        luaL_addvalue(&local_2048);
        break;
      case 0x71:
        local_2280 = lj_lib_checkstr(local_22b0,iVar8);
        local_2288 = (ulong)local_2280->len;
        if ((&stack0xffffffffffffffd0 <= local_2048.p) &&
           (iVar8 = emptybuffer(&local_2048), iVar8 != 0)) {
          adjuststack(&local_2048);
        }
        pcVar13 = local_2048.p + 1;
        *local_2048.p = 0x22;
        local_2048.p = pcVar13;
        if (local_2288 != 0) {
          lVar22 = 0;
          do {
            bVar23 = *(byte *)((long)&local_2280[1].nextgc.gcptr32 + lVar22);
            uVar9 = (uint)bVar23;
            if (((bVar23 == 10) || (bVar23 == 0x5c)) || (bVar23 == 0x22)) {
              if ((&stack0xffffffffffffffd0 <= local_2048.p) &&
                 (iVar8 = emptybuffer(&local_2048), iVar8 != 0)) {
                adjuststack(&local_2048);
              }
              *local_2048.p = 0x5c;
              local_2048.p = local_2048.p + 1;
            }
            else if ((""[(ulong)bVar23 + 1] & 1) != 0) {
              if ((&stack0xffffffffffffffd0 <= local_2048.p) &&
                 (iVar8 = emptybuffer(&local_2048), iVar8 != 0)) {
                adjuststack(&local_2048);
              }
              pcVar13 = local_2048.p + 1;
              *local_2048.p = 0x5c;
              local_2048.p = pcVar13;
              if ((bVar23 < 100) &&
                 ((""[(ulong)*(byte *)((long)&local_2280[1].nextgc.gcptr32 + lVar22 + 1) + 1] & 8)
                  == 0)) {
                if (9 < bVar23) goto LAB_0014589e;
              }
              else {
                if ((&stack0xffffffffffffffd0 <= pcVar13) &&
                   (iVar8 = emptybuffer(&local_2048), iVar8 != 0)) {
                  adjuststack(&local_2048);
                }
                uVar9 = bVar23 - 100;
                if (99 >= bVar23) {
                  uVar9 = (uint)bVar23;
                }
                *local_2048.p = 99 < bVar23 | 0x30;
                local_2048.p = local_2048.p + 1;
LAB_0014589e:
                if ((&stack0xffffffffffffffd0 <= local_2048.p) &&
                   (iVar8 = emptybuffer(&local_2048), iVar8 != 0)) {
                  adjuststack(&local_2048);
                }
                cVar2 = (char)(uVar9 * 0xcd >> 0xb);
                bVar23 = cVar2 * -10 + (char)uVar9;
                *local_2048.p = cVar2 + 0x30;
                local_2048.p = local_2048.p + 1;
              }
              bVar23 = bVar23 + 0x30;
            }
            if ((&stack0xffffffffffffffd0 <= local_2048.p) &&
               (iVar8 = emptybuffer(&local_2048), iVar8 != 0)) {
              adjuststack(&local_2048);
            }
            pcVar13 = local_2048.p + 1;
            *local_2048.p = bVar23;
            lVar22 = lVar22 + 1;
            local_2048.p = pcVar13;
          } while ((int)local_2288 != (int)lVar22);
        }
        if ((&stack0xffffffffffffffd0 <= local_2048.p) &&
           (iVar8 = emptybuffer(&local_2048), iVar8 != 0)) {
          adjuststack(&local_2048);
        }
        *local_2048.p = 0x22;
        local_2048.p = local_2048.p + 1;
        break;
      case 0x73:
        lVar22 = (long)iVar8;
        o = local_22b0->base + lVar22 + -1;
        if (*(int *)((long)local_22b0->base + lVar22 * 8 + -4) == -5) {
          pGVar17 = (GCstr *)(ulong)(o->u32).lo;
          goto LAB_00145643;
        }
        pcVar16 = lj_meta_lookup(local_22b0,o,MM_tostring);
        plVar7 = local_22b0;
        if ((pcVar16->field_2).it != 0xffffffff) {
          pcVar5 = local_22b0->top;
          local_22b0->top = pcVar5 + 1;
          *pcVar5 = *pcVar16;
          pTVar4 = local_22b0->top;
          local_22b0->top = pTVar4 + 1;
          pTVar4->u32 = *(anon_struct_8_2_f9ee98fb_for_u32 *)o;
          lj_vm_call(local_22b0,local_22b0->top + -1,2);
          pTVar6 = plVar7->top;
          pTVar4 = pTVar6 + -1;
          plVar7->top = pTVar4;
          if (*(int *)((long)pTVar6 + -4) == -5) {
            pGVar17 = (GCstr *)(ulong)(pTVar4->u32).lo;
            goto LAB_00145643;
          }
          o = local_22b0->base + lVar22 + -1;
          *o = (cTValue)*(anon_struct_8_2_f9ee98fb_for_u32 *)pTVar4;
        }
        plVar7 = local_22b0;
        uVar9 = (o->field_2).it;
        if (uVar9 < 0xffff0000) {
          pGVar17 = lj_str_fromnumber(local_22b0,o);
          goto LAB_00145643;
        }
        switch(uVar9 & 0xffff) {
        case 0xfff7:
          if (*(byte *)((ulong)(o->u32).lo + 6) < 2) goto switchD_00145a9d_caseD_fff8;
          lj_str_pushf(local_22b0,"function: builtin#%d");
          goto LAB_00145b0a;
        default:
switchD_00145a9d_caseD_fff8:
          uVar18 = (ulong)~uVar9;
          if ((uVar9 & 0xffff8000) == 0xffff0000) {
            uVar18 = 3;
          }
          pcVar13 = lj_obj_itypename[uVar18];
          pvVar11 = lua_topointer(local_22b0,iVar8);
          lj_str_pushf(plVar7,"%s: %p",pcVar13,pvVar11);
LAB_00145b0a:
          pTVar4 = local_22b0->top;
          local_22b0->top = pTVar4 + -1;
          pGVar17 = (GCstr *)(ulong)pTVar4[-1].u32.lo;
          goto LAB_00145643;
        case 0xfffd:
          sVar14 = 4;
          pcVar13 = "true";
          break;
        case 0xfffe:
          sVar14 = 5;
          pcVar13 = "false";
          break;
        case 0xffff:
          sVar14 = 3;
          pcVar13 = "nil";
        }
        pGVar17 = lj_str_new(local_22b0,pcVar13,sVar14);
LAB_00145643:
        pcVar13 = strchr(local_22a8,0x2e);
        if ((pcVar13 == (char *)0x0) && (99 < pGVar17->len)) {
          pTVar4 = local_22b0->top;
          local_22b0->top = pTVar4 + 1;
          (pTVar4->u32).lo = (uint32_t)pGVar17;
          (pTVar4->field_2).it = 0xfffffffb;
          luaL_addvalue(&local_2048);
          break;
        }
        sprintf(local_2248,local_22a8,pGVar17 + 1);
        goto LAB_0014559b;
      }
LAB_001455b6:
    } while (pGVar24 < (GCstr *)((long)&pGVar10[1].nextgc.gcptr32 + (ulong)uVar3));
  }
  emptybuffer(&local_2048);
  lua_concat(local_2048.L,local_2048.lvl);
  return 1;
}

Assistant:

LJLIB_CF(string_format)
{
  int arg = 1, top = (int)(L->top - L->base);
  GCstr *fmt = lj_lib_checkstr(L, arg);
  const char *strfrmt = strdata(fmt);
  const char *strfrmt_end = strfrmt + fmt->len;
  luaL_Buffer b;
  luaL_buffinit(L, &b);
  while (strfrmt < strfrmt_end) {
    if (*strfrmt != L_ESC) {
      luaL_addchar(&b, *strfrmt++);
    } else if (*++strfrmt == L_ESC) {
      luaL_addchar(&b, *strfrmt++);  /* %% */
    } else { /* format item */
      char form[MAX_FMTSPEC];  /* to store the format (`%...') */
      char buff[MAX_FMTITEM];  /* to store the formatted item */
      if (++arg > top)
	luaL_argerror(L, arg, lj_obj_typename[0]);
      strfrmt = scanformat(L, strfrmt, form);
      switch (*strfrmt++) {
      case 'c':
	sprintf(buff, form, lj_lib_checkint(L, arg));
	break;
      case 'd':  case 'i':
	addintlen(form);
	sprintf(buff, form, num2intfrm(L, arg));
	break;
      case 'o':  case 'u':  case 'x':  case 'X':
	addintlen(form);
	sprintf(buff, form, num2uintfrm(L, arg));
	break;
      case 'e':  case 'E': case 'f': case 'g': case 'G': case 'a': case 'A': {
	TValue tv;
	tv.n = lj_lib_checknum(L, arg);
	if (LJ_UNLIKELY((tv.u32.hi << 1) >= 0xffe00000)) {
	  /* Canonicalize output of non-finite values. */
	  char *p, nbuf[LJ_STR_NUMBUF];
	  size_t len = lj_str_bufnum(nbuf, &tv);
	  if (strfrmt[-1] < 'a') {
	    nbuf[len-3] = nbuf[len-3] - 0x20;
	    nbuf[len-2] = nbuf[len-2] - 0x20;
	    nbuf[len-1] = nbuf[len-1] - 0x20;
	  }
	  nbuf[len] = '\0';
	  for (p = form; *p < 'A' && *p != '.'; p++) ;
	  *p++ = 's'; *p = '\0';
	  sprintf(buff, form, nbuf);
	  break;
	}
	sprintf(buff, form, (double)tv.n);
	break;
	}
      case 'q':
	addquoted(L, &b, arg);
	continue;
      case 'p':
	lj_str_pushf(L, "%p", lua_topointer(L, arg));
	luaL_addvalue(&b);
	continue;
      case 's': {
	GCstr *str = meta_tostring(L, arg);
	if (!strchr(form, '.') && str->len >= 100) {
	  /* no precision and string is too long to be formatted;
	     keep original string */
	  setstrV(L, L->top++, str);
	  luaL_addvalue(&b);
	  continue;
	}
	sprintf(buff, form, strdata(str));
	break;
	}
      default:
	lj_err_callerv(L, LJ_ERR_STRFMTO, *(strfrmt -1));
	break;
      }
      luaL_addlstring(&b, buff, strlen(buff));
    }
  }
  luaL_pushresult(&b);
  return 1;
}